

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O2

void __thiscall fuzzFailures_convFailures_Test::TestBody(fuzzFailures_convFailures_Test *this)

{
  bool bVar1;
  uint64_t uVar2;
  undefined8 *local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  allocator local_178 [32];
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  local_188 = 0;
  uStack_180 = 0;
  local_190 = 0;
  local_198 = &local_188;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_38,"+z264",local_178);
    uVar2 = units::getDefaultFlags();
    units::unit_from_string(&local_38,uVar2);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::__cxx11::string::~string((string *)&local_198);
  local_188 = 0;
  uStack_180 = 0;
  local_190 = 0;
  local_198 = &local_188;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_58,"+4560",local_178);
    uVar2 = units::getDefaultFlags();
    units::unit_from_string(&local_58,uVar2);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::~string((string *)&local_198);
  local_188 = 0;
  uStack_180 = 0;
  local_190 = 0;
  local_198 = &local_188;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_78,"24250v",local_178);
    uVar2 = units::getDefaultFlags();
    units::unit_from_string(&local_78,uVar2);
    std::__cxx11::string::~string((string *)&local_78);
  }
  std::__cxx11::string::~string((string *)&local_198);
  local_188 = 0;
  uStack_180 = 0;
  local_190 = 0;
  local_198 = &local_188;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_98,"8(",local_178);
    uVar2 = units::getDefaultFlags();
    units::unit_from_string(&local_98,uVar2);
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::__cxx11::string::~string((string *)&local_198);
  local_188 = 0;
  uStack_180 = 0;
  local_190 = 0;
  local_198 = &local_188;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_b8,"8{",local_178);
    uVar2 = units::getDefaultFlags();
    units::unit_from_string(&local_b8,uVar2);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  std::__cxx11::string::~string((string *)&local_198);
  local_188 = 0;
  uStack_180 = 0;
  local_190 = 0;
  local_198 = &local_188;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_d8,"0^%",local_178);
    uVar2 = units::getDefaultFlags();
    units::unit_from_string(&local_d8,uVar2);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  std::__cxx11::string::~string((string *)&local_198);
  local_188 = 0;
  uStack_180 = 0;
  local_190 = 0;
  local_198 = &local_188;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_f8,"10*1001",local_178);
    uVar2 = units::getDefaultFlags();
    units::unit_from_string(&local_f8,uVar2);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  std::__cxx11::string::~string((string *)&local_198);
  local_188 = 0;
  uStack_180 = 0;
  local_190 = 0;
  local_198 = &local_188;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_118,"s)^(z().",local_178);
    uVar2 = units::getDefaultFlags();
    units::unit_from_string(&local_118,uVar2);
    std::__cxx11::string::~string((string *)&local_118);
  }
  std::__cxx11::string::~string((string *)&local_198);
  local_188 = 0;
  uStack_180 = 0;
  local_190 = 0;
  local_198 = &local_188;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_138,"--+10*+1+110 U",local_178);
    uVar2 = units::getDefaultFlags();
    units::unit_from_string(&local_138,uVar2);
    std::__cxx11::string::~string((string *)&local_138);
  }
  std::__cxx11::string::~string((string *)&local_198);
  local_188 = 0;
  uStack_180 = 0;
  local_190 = 0;
  local_198 = &local_188;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_158,"EQXUN[{ [",local_178);
    uVar2 = units::getDefaultFlags();
    units::unit_from_string(&local_158,uVar2);
    std::__cxx11::string::~string((string *)&local_158);
  }
  std::__cxx11::string::~string((string *)&local_198);
  return;
}

Assistant:

TEST(fuzzFailures, convFailures)
{
    EXPECT_NO_THROW(unit_from_string("+z264"));
    EXPECT_NO_THROW(unit_from_string("+4560"));
    EXPECT_NO_THROW(unit_from_string("24250v"));
    EXPECT_NO_THROW(unit_from_string("8("));
    EXPECT_NO_THROW(unit_from_string("8{"));
    EXPECT_NO_THROW(unit_from_string("0^%"));
    EXPECT_NO_THROW(unit_from_string("10*1001"));
    EXPECT_NO_THROW(unit_from_string("s)^(z()."));
    EXPECT_NO_THROW(unit_from_string("--+10*+1+110 U"));
    EXPECT_NO_THROW(unit_from_string("EQXUN[{ ["));
}